

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O1

void CoreML::Specification::protobuf_GLMClassifier_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_0074a298 == '\x01') {
    DAT_0074a298 = '\0';
    (*(code *)*_GLMClassifier_DoubleArray_default_instance_)();
  }
  if (DAT_0074a2f8 == '\x01') {
    DAT_0074a2f8 = 0;
    (*(code *)*_GLMClassifier_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _GLMClassifier_DoubleArray_default_instance_.Shutdown();
  _GLMClassifier_default_instance_.Shutdown();
}